

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

int duckdb_brotli::SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  HuffmanCode *pHVar14;
  HuffmanCode *pHVar15;
  byte *pbVar16;
  ulong local_40;
  ulong local_38;
  
  uVar3 = s->num_block_types[0];
  if (uVar3 < 2) {
LAB_0036b28c:
    iVar6 = 0;
  }
  else {
    pHVar14 = s->block_type_trees;
    pHVar15 = s->block_len_trees;
    br = &s->br;
    uVar10 = (s->br).val_;
    uVar4 = (s->br).bit_pos_;
    pbVar5 = (s->br).next_in;
    pbVar8 = (s->br).last_in;
    lVar13 = (long)pbVar8 - (long)pbVar5;
    uVar7 = uVar4;
    uVar11 = uVar10;
    pbVar16 = pbVar5;
    while (uVar7 < 0xf) {
      if (pbVar16 == pbVar8) {
        iVar6 = SafeDecodeSymbol(pHVar14,br,&local_40);
        if (iVar6 == 0) goto LAB_0036b28c;
        goto LAB_0036b0fd;
      }
      uVar11 = uVar11 | (ulong)*pbVar16 << ((byte)uVar7 & 0x3f);
      (s->br).val_ = uVar11;
      uVar7 = uVar7 + 8;
      (s->br).bit_pos_ = uVar7;
      pbVar16 = pbVar16 + 1;
      (s->br).next_in = pbVar16;
    }
    pHVar14 = pHVar14 + (uVar11 & 0xff);
    uVar9 = (ulong)pHVar14->bits;
    uVar12 = uVar11;
    if (8 < uVar9) {
      uVar7 = uVar7 - 8;
      uVar12 = uVar11 >> 8;
      pHVar14 = pHVar14 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar14->bits - 8) * 8) &
                                  (uint)(uVar11 >> 8) & 0x7f) + (ulong)pHVar14->value;
      uVar9 = (ulong)pHVar14->bits;
    }
    (s->br).bit_pos_ = uVar7 - uVar9;
    (s->br).val_ = uVar12 >> ((byte)uVar9 & 0x3f);
    local_40 = (ulong)pHVar14->value;
LAB_0036b0fd:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar7 = (s->br).bit_pos_;
      while (uVar7 < 0xf) {
        pbVar8 = (s->br).next_in;
        if (pbVar8 == (s->br).last_in) {
          iVar6 = SafeDecodeSymbol(pHVar15,br,&local_38);
          if (iVar6 != 0) goto LAB_0036b1c0;
          goto LAB_0036b255;
        }
        (s->br).val_ = (s->br).val_ | (ulong)*pbVar8 << ((byte)uVar7 & 0x3f);
        uVar7 = uVar7 + 8;
        (s->br).bit_pos_ = uVar7;
        (s->br).next_in = pbVar8 + 1;
      }
      uVar11 = br->val_;
      pHVar15 = pHVar15 + (uVar11 & 0xff);
      uVar9 = (ulong)pHVar15->bits;
      uVar12 = uVar11;
      if (8 < uVar9) {
        uVar7 = uVar7 - 8;
        uVar12 = uVar11 >> 8;
        pHVar15 = pHVar15 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar15->bits - 8) * 8) &
                                    (uint)(uVar11 >> 8) & 0x7f) + (ulong)pHVar15->value;
        uVar9 = (ulong)pHVar15->bits;
      }
      (s->br).bit_pos_ = uVar7 - uVar9;
      (s->br).val_ = uVar12 >> ((byte)uVar9 & 0x3f);
      local_38 = (ulong)pHVar15->value;
    }
    else {
      local_38 = s->block_length_index;
    }
LAB_0036b1c0:
    bVar1 = (&DAT_00452652)[local_38 * 4];
    uVar11 = (ulong)bVar1;
    uVar2 = (&_kBrotliPrefixCodeRanges)[local_38 * 2];
    uVar7 = (s->br).bit_pos_;
    while (uVar7 < uVar11) {
      pbVar8 = (s->br).next_in;
      if (pbVar8 == (s->br).last_in) {
        s->block_length_index = local_38;
LAB_0036b255:
        s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
        (s->br).val_ = uVar10;
        (s->br).bit_pos_ = uVar4;
        (s->br).next_in = pbVar5;
        (s->br).last_in = pbVar5 + lVar13;
        pbVar8 = pbVar5 + lVar13 + -0x1b;
        if (0xffffffffffffffe2 < lVar13 - 0x1cU) {
          pbVar8 = pbVar5;
        }
        (s->br).guard_in = pbVar8;
        goto LAB_0036b28c;
      }
      (s->br).val_ = (s->br).val_ | (ulong)*pbVar8 << ((byte)uVar7 & 0x3f);
      uVar7 = uVar7 + 8;
      (s->br).bit_pos_ = uVar7;
      (s->br).next_in = pbVar8 + 1;
    }
    uVar10 = (s->br).val_;
    uVar4 = *(ulong *)(kBrotliBitMask + uVar11 * 8);
    (s->br).bit_pos_ = uVar7 - uVar11;
    (s->br).val_ = uVar10 >> (bVar1 & 0x3f);
    s->block_length[0] = (uVar4 & uVar10) + (ulong)uVar2;
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_40 == 0) {
      local_40 = s->block_type_rb[0];
    }
    else if (local_40 == 1) {
      local_40 = s->block_type_rb[1] + 1;
    }
    else {
      local_40 = local_40 - 2;
    }
    uVar10 = 0;
    if (uVar3 <= local_40) {
      uVar10 = uVar3;
    }
    local_40 = local_40 - uVar10;
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_40;
    s->context_map_slice = s->context_map + local_40 * 0x40;
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_40 >> 5] >> ((uint)local_40 & 0x1f) & 1) != 0);
    s->literal_htree = (s->literal_hgroup).htrees[s->context_map[local_40 * 0x40]];
    s->context_lookup = &_kBrotliContextLookupTable + ((s->context_modes[local_40] & 3) << 9);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}